

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O2

void __thiscall
ParticleArrayTest_Assignment_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>_>::
TestBody(ParticleArrayTest_Assignment_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>_>
         *this)

{
  long lVar1;
  int iVar2;
  Particle *pPVar3;
  double *pdVar4;
  bool bVar5;
  byte bVar6;
  Particle<(pica::Dimension)3> in_stack_fffffffffffffc48;
  AssertHelper local_370;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_368;
  String local_360;
  AssertionResult gtest_ar_;
  ParticleArray particles;
  ParticleArray particlesCopy;
  ParticleArray particlesAnotherCopy;
  Particle local_b8;
  Particle local_70;
  
  bVar6 = 0;
  memset(&particles,0,0xd8);
  memset(&particlesCopy,0,0xd8);
  memset(&particlesAnotherCopy,0,0xd8);
  iVar2 = 9;
  while (bVar5 = iVar2 != 0, iVar2 = iVar2 + -1, bVar5) {
    BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>::randomParticle
              (&local_70,(BaseParticleFixture<pica::Particle<(pica::Dimension)3>_> *)this);
    pPVar3 = &local_70;
    pdVar4 = (double *)&stack0xfffffffffffffc48;
    for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
      *pdVar4 = (pPVar3->position).x;
      pPVar3 = (Particle *)((long)pPVar3 + (ulong)bVar6 * -0x10 + 8);
      pdVar4 = pdVar4 + (ulong)bVar6 * -2 + 1;
    }
    pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>>::
    pushBack<pica::Particle<(pica::Dimension)3>>
              ((ParticleArraySoA<pica::Particle<(pica::Dimension)3>> *)&particles,
               in_stack_fffffffffffffc48);
  }
  iVar2 = 0xb;
  while (bVar5 = iVar2 != 0, iVar2 = iVar2 + -1, bVar5) {
    BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>::randomParticle
              (&local_b8,(BaseParticleFixture<pica::Particle<(pica::Dimension)3>_> *)this);
    pPVar3 = &local_b8;
    pdVar4 = (double *)&stack0xfffffffffffffc48;
    for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
      *pdVar4 = (pPVar3->position).x;
      pPVar3 = (Particle *)((long)pPVar3 + (ulong)bVar6 * -0x10 + 8);
      pdVar4 = pdVar4 + (ulong)bVar6 * -2 + 1;
    }
    pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>>::
    pushBack<pica::Particle<(pica::Dimension)3>>
              ((ParticleArraySoA<pica::Particle<(pica::Dimension)3>> *)&particlesCopy,
               in_stack_fffffffffffffc48);
  }
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>::operator=(&particlesCopy,&particles);
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>::operator=
            (&particlesAnotherCopy,&particles);
  gtest_ar_.success_ =
       ParticleArrayTest<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>_>::
       eqParticleArrays(&this->
                         super_ParticleArrayTest<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>_>
                        ,&particles,&particlesCopy);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (gtest_ar_.success_) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    gtest_ar_.success_ =
         ParticleArrayTest<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>_>::
         eqParticleArrays(&this->
                           super_ParticleArrayTest<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>_>
                          ,&particles,&particlesAnotherCopy);
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (gtest_ar_.success_) goto LAB_0019d994;
    testing::Message::Message((Message *)&local_368);
    testing::internal::GetBoolAssertionFailureMessage
              ((internal *)&local_360,&gtest_ar_,
               "this->eqParticleArrays(particles, particlesAnotherCopy)","false","true");
    testing::internal::AssertHelper::AssertHelper
              (&local_370,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
               ,0x3a,local_360.c_str_);
    testing::internal::AssertHelper::operator=(&local_370,(Message *)&local_368);
  }
  else {
    testing::Message::Message((Message *)&local_368);
    testing::internal::GetBoolAssertionFailureMessage
              ((internal *)&local_360,&gtest_ar_,"this->eqParticleArrays(particles, particlesCopy)",
               "false","true");
    testing::internal::AssertHelper::AssertHelper
              (&local_370,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
               ,0x39,local_360.c_str_);
    testing::internal::AssertHelper::operator=(&local_370,(Message *)&local_368);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_370);
  testing::internal::String::~String(&local_360);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_368);
LAB_0019d994:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>::~ParticleArraySoA
            (&particlesAnotherCopy);
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>::~ParticleArraySoA(&particlesCopy);
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>::~ParticleArraySoA(&particles);
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, Assignment)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;

    ParticleArray particles, particlesCopy, particlesAnotherCopy;
    for (int i = 0; i < 9; i++)
        particles.pushBack(this->randomParticle());
    for (int i = 0; i < 11; i++)
        particlesCopy.pushBack(this->randomParticle());
    particlesCopy = particles;
    particlesAnotherCopy = particles;
    ASSERT_TRUE(this->eqParticleArrays(particles, particlesCopy));
    ASSERT_TRUE(this->eqParticleArrays(particles, particlesAnotherCopy));
}